

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
SmallArray<FunctionValue,_1U>::grow(SmallArray<FunctionValue,_1U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  FunctionValue *pFVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  FunctionValue *__s;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = (this->max >> 1) + this->max;
  uVar4 = newSize + 4;
  if (newSize < uVar8) {
    uVar4 = uVar8;
  }
  if (this->allocator == (Allocator *)0x0) {
    __s = (FunctionValue *)(*(code *)NULLC::alloc)(uVar4 * 0x18 + 4);
  }
  else {
    iVar6 = (*this->allocator->_vptr_Allocator[2])();
    __s = (FunctionValue *)CONCAT44(extraout_var,iVar6);
  }
  if (uVar4 != 0) {
    memset(__s,0,(((long)(int)uVar4 * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (this->count != 0) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      pFVar3 = this->data;
      *(undefined8 *)((long)&__s->context + lVar7) = *(undefined8 *)((long)&pFVar3->context + lVar7)
      ;
      puVar1 = (undefined8 *)((long)&pFVar3->source + lVar7);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&__s->source + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar9 < this->count);
  }
  pFVar3 = this->data;
  if (pFVar3 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pFVar3 != (FunctionValue *)0x0) {
        (*(code *)NULLC::dealloc)(pFVar3);
      }
    }
    else if (pFVar3 != (FunctionValue *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = __s;
  this->max = uVar4;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}